

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall xmrig::Network::getConnection(Network *this,Value *reply,Document *doc,int version)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  int in_ECX;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  Value connection;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  undefined4 in_stack_fffffffffffffe78;
  Type in_stack_fffffffffffffe7c;
  NetworkState *in_stack_fffffffffffffe80;
  String *in_stack_fffffffffffffe98;
  NetworkState *in_stack_fffffffffffffed8;
  StringRefType *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  GenericStringRef<char> local_108;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_f8;
  GenericStringRef<char> local_e8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_d8;
  GenericStringRef<char> local_c8;
  GenericStringRef<char> local_b8;
  GenericStringRef<char> local_a8;
  GenericStringRef<char> local_98;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_88;
  GenericStringRef<char> local_78 [3];
  GenericStringRef<char> local_48;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_38;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_28;
  int local_1c;
  
  local_1c = in_ECX;
  local_28 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_48,(char (*) [5])0x2791e2);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffef0,(StringRefType *)in_stack_fffffffffffffee8,
            in_stack_fffffffffffffee0,
            (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_fffffffffffffed8);
  rapidjson::GenericStringRef<char>::GenericStringRef<3u>(local_78,(char (*) [3])"ip");
  allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                 NetworkState::ip((NetworkState *)(in_RDI + 4));
  String::toJSON(in_stack_fffffffffffffe98);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,in_RDI,
            allocator_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_88);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_98,(char (*) [7])"uptime");
  NetworkState::connectionTime(in_stack_fffffffffffffe80);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
             (unsigned_long)in_RDI,allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_a8,(char (*) [5])"ping");
  NetworkState::latency(in_stack_fffffffffffffed8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
             (uint)((ulong)in_RDI >> 0x20),allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_b8,(char (*) [9])"failures");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
             (unsigned_long)in_RDI,allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<4u>(&local_c8,(char (*) [4])"tls");
  NetworkState::tls((NetworkState *)(in_RDI + 4));
  String::toJSON(in_stack_fffffffffffffe98);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,in_RDI,
            allocator_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_d8);
  rapidjson::GenericStringRef<char>::GenericStringRef<16u>
            (&local_e8,(char (*) [16])"tls-fingerprint");
  NetworkState::fingerprint((NetworkState *)(in_RDI + 4));
  String::toJSON(in_stack_fffffffffffffe98);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,in_RDI,
            allocator_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_f8);
  if (local_1c == 1) {
    rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_108,(char (*) [10])"error_log");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,in_RDI,
              allocator_00);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&stack0xfffffffffffffee8);
  }
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>
            ((GenericStringRef<char> *)&stack0xfffffffffffffed8,(char (*) [11])0x27bc16);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,in_RDI,
            allocator_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_38);
  return;
}

Assistant:

void xmrig::Network::getConnection(rapidjson::Value &reply, rapidjson::Document &doc, int version) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value connection(kObjectType);
    connection.AddMember("pool",            StringRef(m_state.pool), allocator);
    connection.AddMember("ip",              m_state.ip().toJSON(), allocator);
    connection.AddMember("uptime",          m_state.connectionTime(), allocator);
    connection.AddMember("ping",            m_state.latency(), allocator);
    connection.AddMember("failures",        m_state.failures, allocator);
    connection.AddMember("tls",             m_state.tls().toJSON(), allocator);
    connection.AddMember("tls-fingerprint", m_state.fingerprint().toJSON(), allocator);

    if (version == 1) {
        connection.AddMember("error_log", Value(kArrayType), allocator);
    }

    reply.AddMember("connection", connection, allocator);
}